

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreSieve.cpp
# Opt level: O2

void primesieve::PreSieve::preSieve
               (Vector<unsigned_char,_std::allocator<unsigned_char>_> *sieve,uint64_t segmentLow)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  byte bVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  uchar *puVar27;
  ulong uVar28;
  uint8_t *preSieved2;
  ulong uVar29;
  uint8_t *preSieved1;
  uint8_t *preSieved0;
  uint8_t *puVar30;
  uchar *puVar31;
  uint8_t *sieve_00;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  Array<unsigned_char,_8UL> primeBits;
  
  bVar22 = (anonymous_namespace)::cpu_supports_avx512_bw;
  uVar38 = (segmentLow % 0x2ba16) / 0x1e;
  uVar32 = (segmentLow % 0x2f742) / 0x1e;
  uVar34 = (segmentLow % 0x2ef0e) / 0x1e;
  uVar28 = 0;
  uVar29 = (segmentLow % 0x30f2a) / 0x1e;
  while( true ) {
    puVar31 = sieve->array_;
    puVar27 = sieve->end_;
    uVar23 = ((long)puVar27 - (long)puVar31) - uVar28;
    if ((ulong)((long)puVar27 - (long)puVar31) < uVar28 || uVar23 == 0) break;
    uVar24 = 0x1745 - uVar38;
    if (uVar23 <= 0x1745 - uVar38) {
      uVar24 = uVar23;
    }
    uVar23 = 0x194f - uVar32;
    if (uVar24 <= 0x194f - uVar32) {
      uVar23 = uVar24;
    }
    uVar24 = 0x1909 - uVar34;
    if (uVar23 <= 0x1909 - uVar34) {
      uVar24 = uVar23;
    }
    uVar23 = 0x1a1b - uVar29;
    if (uVar24 <= 0x1a1b - uVar29) {
      uVar23 = uVar24;
    }
    puVar30 = puVar31 + uVar28;
    if ((bVar22 & 1) == 0) {
      for (uVar24 = 0; uVar24 < (uVar23 & 0xfffffffffffffff0); uVar24 = uVar24 + 0x10) {
        puVar1 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE_ + uVar38 + uVar24);
        uVar7 = puVar1[1];
        uVar8 = puVar1[2];
        uVar9 = puVar1[3];
        puVar2 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE0_ + uVar32 + uVar24);
        uVar10 = puVar2[1];
        uVar11 = puVar2[2];
        uVar12 = puVar2[3];
        puVar3 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE1_ + uVar34 + uVar24);
        uVar13 = puVar3[1];
        uVar14 = puVar3[2];
        uVar15 = puVar3[3];
        puVar4 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE2_ + uVar29 + uVar24);
        uVar16 = puVar4[1];
        uVar17 = puVar4[2];
        uVar18 = puVar4[3];
        puVar5 = (uint *)(puVar30 + uVar24);
        *puVar5 = *puVar4 & *puVar3 & *puVar2 & *puVar1;
        puVar5[1] = uVar16 & uVar13 & uVar10 & uVar7;
        puVar5[2] = uVar17 & uVar14 & uVar11 & uVar8;
        puVar5[3] = uVar18 & uVar15 & uVar12 & uVar9;
      }
      for (; uVar24 < uVar23; uVar24 = uVar24 + 1) {
        puVar30[uVar24] =
             _ZGRN12_GLOBAL__N_114preSieveTablesE0_[uVar32 + uVar24] &
             _ZGRN12_GLOBAL__N_114preSieveTablesE_[uVar38 + uVar24] &
             _ZGRN12_GLOBAL__N_114preSieveTablesE1_[uVar24 + uVar34] &
             _ZGRN12_GLOBAL__N_114preSieveTablesE2_[uVar24 + uVar29];
      }
    }
    else {
      anon_unknown.dwarf_1877dc::presieve1_x86_avx512
                (_ZGRN12_GLOBAL__N_114preSieveTablesE_ + uVar38,
                 _ZGRN12_GLOBAL__N_114preSieveTablesE0_ + uVar32,
                 _ZGRN12_GLOBAL__N_114preSieveTablesE1_ + uVar34,
                 _ZGRN12_GLOBAL__N_114preSieveTablesE2_ + uVar29,puVar30,uVar23);
    }
    uVar28 = uVar28 + uVar23;
    bVar40 = 0x1744 < uVar38;
    uVar38 = uVar23 + uVar38;
    if (bVar40) {
      uVar38 = 0;
    }
    bVar40 = 0x194e < uVar32;
    uVar32 = uVar23 + uVar32;
    if (bVar40) {
      uVar32 = 0;
    }
    bVar40 = 0x1908 < uVar34;
    uVar34 = uVar23 + uVar34;
    if (bVar40) {
      uVar34 = 0;
    }
    bVar40 = 0x1a1a < uVar29;
    uVar29 = uVar23 + uVar29;
    if (bVar40) {
      uVar29 = 0;
    }
  }
  for (uVar38 = 4; uVar38 < 0x10; uVar38 = uVar38 + 4) {
    lVar25 = uVar38 * 0x10;
    uVar32 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar25 + 8);
    uVar34 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar25 + 0x18);
    uVar29 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar25 + 0x28);
    uVar28 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar25 + 0x38);
    uVar23 = (segmentLow % (uVar28 * 0x1e)) / 0x1e;
    uVar37 = 0;
    uVar24 = (segmentLow % (uVar34 * 0x1e)) / 0x1e;
    uVar35 = (segmentLow % (uVar29 * 0x1e)) / 0x1e;
    uVar33 = (segmentLow % (uVar32 * 0x1e)) / 0x1e;
    while (uVar26 = ((long)puVar27 - (long)puVar31) - uVar37,
          uVar37 <= (ulong)((long)puVar27 - (long)puVar31) && uVar26 != 0) {
      uVar39 = uVar32 - uVar33;
      if (uVar26 <= uVar32 - uVar33) {
        uVar39 = uVar26;
      }
      uVar26 = uVar34 - uVar24;
      if (uVar39 <= uVar34 - uVar24) {
        uVar26 = uVar39;
      }
      uVar39 = uVar29 - uVar35;
      if (uVar26 <= uVar29 - uVar35) {
        uVar39 = uVar26;
      }
      uVar26 = uVar28 - uVar23;
      if (uVar39 <= uVar28 - uVar23) {
        uVar26 = uVar39;
      }
      preSieved0 = (uint8_t *)(*(long *)((anonymous_namespace)::preSieveTables + lVar25) + uVar33);
      preSieved1 = (uint8_t *)
                   (*(long *)((anonymous_namespace)::preSieveTables + lVar25 + 0x10) + uVar24);
      preSieved2 = (uint8_t *)
                   (*(long *)((anonymous_namespace)::preSieveTables + lVar25 + 0x20) + uVar35);
      puVar30 = (uint8_t *)
                (*(long *)((anonymous_namespace)::preSieveTables + lVar25 + 0x30) + uVar23);
      sieve_00 = puVar31 + uVar37;
      if ((bVar22 & 1) == 0) {
        for (uVar39 = 0; uVar39 < (uVar26 & 0xfffffffffffffff0); uVar39 = uVar39 + 0x10) {
          puVar1 = (uint *)(sieve_00 + uVar39);
          uVar7 = puVar1[1];
          uVar8 = puVar1[2];
          uVar9 = puVar1[3];
          puVar2 = (uint *)(preSieved0 + uVar39);
          uVar10 = puVar2[1];
          uVar11 = puVar2[2];
          uVar12 = puVar2[3];
          puVar3 = (uint *)(preSieved1 + uVar39);
          uVar13 = puVar3[1];
          uVar14 = puVar3[2];
          uVar15 = puVar3[3];
          puVar4 = (uint *)(preSieved2 + uVar39);
          uVar16 = puVar4[1];
          uVar17 = puVar4[2];
          uVar18 = puVar4[3];
          puVar5 = (uint *)(puVar30 + uVar39);
          uVar19 = puVar5[1];
          uVar20 = puVar5[2];
          uVar21 = puVar5[3];
          puVar6 = (uint *)(sieve_00 + uVar39);
          *puVar6 = *puVar5 & *puVar4 & *puVar3 & *puVar2 & *puVar1;
          puVar6[1] = uVar19 & uVar16 & uVar13 & uVar10 & uVar7;
          puVar6[2] = uVar20 & uVar17 & uVar14 & uVar11 & uVar8;
          puVar6[3] = uVar21 & uVar18 & uVar15 & uVar12 & uVar9;
        }
        for (; uVar39 < uVar26; uVar39 = uVar39 + 1) {
          sieve_00[uVar39] =
               sieve_00[uVar39] &
               preSieved1[uVar39] & preSieved0[uVar39] & preSieved2[uVar39] & puVar30[uVar39];
        }
      }
      else {
        anon_unknown.dwarf_1877dc::presieve2_x86_avx512
                  (preSieved0,preSieved1,preSieved2,puVar30,sieve_00,uVar26);
      }
      uVar37 = uVar37 + uVar26;
      uVar39 = uVar26 + uVar33;
      if (uVar32 <= uVar33) {
        uVar39 = 0;
      }
      uVar33 = uVar26 + uVar24;
      if (uVar34 <= uVar24) {
        uVar33 = 0;
      }
      uVar36 = uVar26 + uVar35;
      if (uVar29 <= uVar35) {
        uVar36 = 0;
      }
      bVar40 = uVar28 <= uVar23;
      uVar23 = uVar26 + uVar23;
      if (bVar40) {
        uVar23 = 0;
      }
      puVar31 = sieve->array_;
      uVar24 = uVar33;
      uVar35 = uVar36;
      uVar33 = uVar39;
      puVar27 = sieve->end_;
    }
  }
  if (segmentLow < 0xa4) {
    uVar38 = (ulong)(byte)(((ushort)segmentLow & 0xff) / 0x1e);
    primeBits.array_[0] = 0xff;
    primeBits.array_[1] = 0xef;
    primeBits.array_[2] = 'w';
    primeBits.array_[3] = '?';
    primeBits.array_[4] = 0xdb;
    primeBits.array_[5] = 0xed;
    primeBits.array_[6] = 0x9e;
    primeBits.array_[7] = 0xfc;
    for (lVar25 = 0; 8 - uVar38 != lVar25; lVar25 = lVar25 + 1) {
      puVar31[lVar25] = primeBits.array_[lVar25 + uVar38];
    }
  }
  return;
}

Assistant:

void PreSieve::preSieve(Vector<uint8_t>& sieve, uint64_t segmentLow)
{
  uint64_t offset = 0;
  uint64_t pos0, pos1, pos2, pos3;

  pos0 = (segmentLow % (preSieveTables[0].size() * 30)) / 30;
  pos1 = (segmentLow % (preSieveTables[1].size() * 30)) / 30;
  pos2 = (segmentLow % (preSieveTables[2].size() * 30)) / 30;
  pos3 = (segmentLow % (preSieveTables[3].size() * 30)) / 30;

  // PreSieve algo 1
  while (offset < sieve.size())
  {
    uint64_t bytesToCopy = sieve.size() - offset;

    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[0].size() - pos0));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[1].size() - pos1));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[2].size() - pos2));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[3].size() - pos3));

    presieve1(&*(preSieveTables[0].begin() + pos0),
              &*(preSieveTables[1].begin() + pos1),
              &*(preSieveTables[2].begin() + pos2),
              &*(preSieveTables[3].begin() + pos3),
              &sieve[offset],
              bytesToCopy);

    offset += bytesToCopy;

    pos0 = (pos0 + bytesToCopy) * (pos0 < preSieveTables[0].size());
    pos1 = (pos1 + bytesToCopy) * (pos1 < preSieveTables[1].size());
    pos2 = (pos2 + bytesToCopy) * (pos2 < preSieveTables[2].size());
    pos3 = (pos3 + bytesToCopy) * (pos3 < preSieveTables[3].size());
  }

  // PreSieve algo 2
  for (std::size_t i = 4; i < preSieveTables.size(); i += 4)
  {
    offset = 0;

    pos0 = (segmentLow % (preSieveTables[i+0].size() * 30)) / 30;
    pos1 = (segmentLow % (preSieveTables[i+1].size() * 30)) / 30;
    pos2 = (segmentLow % (preSieveTables[i+2].size() * 30)) / 30;
    pos3 = (segmentLow % (preSieveTables[i+3].size() * 30)) / 30;

    while (offset < sieve.size())
    {
      uint64_t bytesToCopy = sieve.size() - offset;

      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+0].size() - pos0));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+1].size() - pos1));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+2].size() - pos2));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+3].size() - pos3));

      presieve2(&*(preSieveTables[i+0].begin() + pos0),
                &*(preSieveTables[i+1].begin() + pos1),
                &*(preSieveTables[i+2].begin() + pos2),
                &*(preSieveTables[i+3].begin() + pos3),
                &sieve[offset],
                bytesToCopy);

      offset += bytesToCopy;

      pos0 = (pos0 + bytesToCopy) * (pos0 < preSieveTables[i+0].size());
      pos1 = (pos1 + bytesToCopy) * (pos1 < preSieveTables[i+1].size());
      pos2 = (pos2 + bytesToCopy) * (pos2 < preSieveTables[i+2].size());
      pos3 = (pos3 + bytesToCopy) * (pos3 < preSieveTables[i+3].size());
    }
  }

  // Pre-sieving removes the primes <= 163. We
  // have to undo that work and reset these bits
  // to 1 (but 49 = 7 * 7 is not a prime).
  if (segmentLow <= getMaxPrime())
  {
    uint64_t i = segmentLow / 30;
    uint8_t* sieveArray = sieve.data();
    Array<uint8_t, 8> primeBits = { 0xff, 0xef, 0x77, 0x3f, 0xdb, 0xed, 0x9e, 0xfc };

    ASSERT(sieve.capacity() >= primeBits.size());
    for (std::size_t j = 0; i + j < primeBits.size(); j++)
      sieveArray[j] = primeBits[i + j];
  }
}